

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O0

void __thiscall
btMultiBodyPoint2Point::btMultiBodyPoint2Point
          (btMultiBodyPoint2Point *this,btMultiBody *bodyA,int linkA,btMultiBody *bodyB,int linkB,
          btVector3 *pivotInA,btVector3 *pivotInB)

{
  undefined8 uVar1;
  int iVar2;
  btMultiBody *in_RDI;
  btAlignedObjectArray<float> *in_R9;
  undefined8 *in_stack_00000008;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffbc;
  btMultiBodyConstraint *in_stack_ffffffffffffffc0;
  
  btMultiBodyConstraint::btMultiBodyConstraint
            (in_stack_ffffffffffffffc0,(btMultiBody *)CONCAT44(in_stack_ffffffffffffffbc,3),in_RDI,
             in_stack_ffffffffffffffac,0,0,false);
  in_RDI->_vptr_btMultiBody = (_func_int **)&PTR__btMultiBodyPoint2Point_002e80e0;
  (in_RDI->m_baseTorque).m_floats[1] = 0.0;
  (in_RDI->m_baseTorque).m_floats[2] = 0.0;
  *(undefined8 *)((in_RDI->m_baseTorque).m_floats + 3) = 0;
  iVar2 = in_R9->m_size;
  uVar1 = *(undefined8 *)&in_R9->m_capacity;
  (in_RDI->m_baseConstraintForce).m_floats[1] = (btScalar)*(undefined4 *)&in_R9->field_0x0;
  (in_RDI->m_baseConstraintForce).m_floats[2] = (btScalar)iVar2;
  *(undefined8 *)((in_RDI->m_baseConstraintForce).m_floats + 3) = uVar1;
  uVar1 = in_stack_00000008[1];
  *(undefined8 *)((in_RDI->m_baseConstraintTorque).m_floats + 1) = *in_stack_00000008;
  *(undefined8 *)((in_RDI->m_baseConstraintTorque).m_floats + 3) = uVar1;
  btAlignedObjectArray<float>::resize(in_R9,0,(float *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

btMultiBodyPoint2Point::btMultiBodyPoint2Point(btMultiBody* bodyA, int linkA, btMultiBody* bodyB, int linkB, const btVector3& pivotInA, const btVector3& pivotInB)
	:btMultiBodyConstraint(bodyA,bodyB,linkA,linkB,BTMBP2PCONSTRAINT_DIM,false),
	m_rigidBodyA(0),
	m_rigidBodyB(0),
	m_pivotInA(pivotInA),
	m_pivotInB(pivotInB)
{
    m_data.resize(BTMBP2PCONSTRAINT_DIM);//at least store the applied impulses
}